

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.hpp
# Opt level: O2

void __thiscall
unodb::qsbr::register_dealloc_stats_per_thread_between_epoch_changes
          (qsbr *this,size_t total_size,size_t count)

{
  size_t local_30;
  size_t total_size_local;
  size_t count_local;
  
  local_30 = total_size;
  total_size_local = count;
  std::mutex::lock(&this->dealloc_stats_lock);
  boost::accumulators::
  accumulator_set<unsigned_long,boost::accumulators::stats<boost::accumulators::tag::max,boost::accumulators::tag::variance,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,void>
  ::operator()(&this->deallocation_size_per_thread_stats,&local_30);
  (this->deallocation_size_per_thread_max).super___atomic_base<unsigned_long>._M_i =
       (this->deallocation_size_per_thread_stats).accumulators.car.super_max_impl<unsigned_long>.
       max_;
  (this->deallocation_size_per_thread_mean).super___atomic_float<double>._M_fp =
       (this->deallocation_size_per_thread_stats).accumulators.cdr.cdr.car.
       super_immediate_mean_impl<unsigned_long,_boost::accumulators::tag::sample>.mean;
  (this->deallocation_size_per_thread_variance).super___atomic_float<double>._M_fp =
       (this->deallocation_size_per_thread_stats).accumulators.cdr.cdr.cdr.car.
       super_variance_impl<unsigned_long,_boost::accumulators::tag::mean,_boost::accumulators::tag::sample>
       .variance;
  boost::accumulators::
  accumulator_set<unsigned_long,boost::accumulators::stats<boost::accumulators::tag::max,boost::accumulators::tag::variance,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,void>
  ::operator()(&this->epoch_dealloc_per_thread_count_stats,&total_size_local);
  (this->epoch_dealloc_per_thread_count_max).super___atomic_base<unsigned_long>._M_i =
       (this->epoch_dealloc_per_thread_count_stats).accumulators.car.super_max_impl<unsigned_long>.
       max_;
  (this->epoch_dealloc_per_thread_count_variance).super___atomic_float<double>._M_fp =
       (this->epoch_dealloc_per_thread_count_stats).accumulators.cdr.cdr.cdr.car.
       super_variance_impl<unsigned_long,_boost::accumulators::tag::mean,_boost::accumulators::tag::sample>
       .variance;
  pthread_mutex_unlock((pthread_mutex_t *)&this->dealloc_stats_lock);
  return;
}

Assistant:

void register_dealloc_stats_per_thread_between_epoch_changes(
      std::size_t total_size, std::size_t count) {
    const std::lock_guard guard{dealloc_stats_lock};
    deallocation_size_per_thread_stats(total_size);
    publish_deallocation_size_stats();
    epoch_dealloc_per_thread_count_stats(count);
    publish_epoch_callback_stats();
  }